

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O2

Nm_Man_t * Nm_ManCreate(int nSize)

{
  ulong uVar1;
  uint uVar2;
  Nm_Man_t *pNVar3;
  Nm_Entry_t **ppNVar4;
  Extra_MmFlex_t *pEVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  pNVar3 = (Nm_Man_t *)calloc(1,0x28);
  pNVar3->nSizeFactor = 2;
  pNVar3->nGrowthFactor = 3;
  uVar6 = nSize - 1;
  do {
    do {
      uVar7 = uVar6 + 1;
      uVar2 = uVar6 & 1;
      uVar6 = uVar7;
    } while (uVar2 != 0);
    uVar9 = 3;
    do {
      iVar8 = (int)uVar9;
      if (uVar7 < (uint)(iVar8 * iVar8)) {
        pNVar3->nBins = uVar7;
        ppNVar4 = (Nm_Entry_t **)calloc(1,(long)(int)uVar7 << 3);
        pNVar3->pBinsI2N = ppNVar4;
        ppNVar4 = (Nm_Entry_t **)calloc(1,(long)(int)uVar7 << 3);
        pNVar3->pBinsN2I = ppNVar4;
        pEVar5 = Extra_MmFlexStart();
        pNVar3->pMem = pEVar5;
        return pNVar3;
      }
      uVar1 = (ulong)uVar7 % uVar9;
      uVar9 = (ulong)(iVar8 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the name manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nm_Man_t * Nm_ManCreate( int nSize )
{
    Nm_Man_t * p;
    // allocate the table
    p = ABC_ALLOC( Nm_Man_t, 1 );
    memset( p, 0, sizeof(Nm_Man_t) );
    // set the parameters
    p->nSizeFactor   = 2; // determined the limit on the grow of data before the table resizes
    p->nGrowthFactor = 3; // determined how much the table grows after resizing
    // allocate and clean the bins
    p->nBins = Abc_PrimeCudd(nSize);
    p->pBinsI2N = ABC_ALLOC( Nm_Entry_t *, p->nBins );
    p->pBinsN2I = ABC_ALLOC( Nm_Entry_t *, p->nBins );
    memset( p->pBinsI2N, 0, sizeof(Nm_Entry_t *) * p->nBins );
    memset( p->pBinsN2I, 0, sizeof(Nm_Entry_t *) * p->nBins );
    // start the memory manager
    p->pMem = Extra_MmFlexStart();
    return p;
}